

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

int set_strap_from_string(char *strap_s)

{
  ulong uVar1;
  unsigned_long value;
  char *end_ptr;
  char *strap_s_local;
  
  if (strap_s != (char *)0x0) {
    end_ptr = strap_s;
    uVar1 = strtoul(strap_s,(char **)&value,0x10);
    if (uVar1 != 0xffffffffffffffff) {
      strap = (uint32_t)uVar1;
      printf("Strap set to 0x%x\n",uVar1 & 0xffffffff);
      return 0;
    }
    fprintf(_stderr,"Invalid strap value!\n");
  }
  return 1;
}

Assistant:

int set_strap_from_string(const char* strap_s)
{
	char* end_ptr;
	unsigned long int value;

	if (strap_s != NULL) {
		value = strtoul(strap_s, &end_ptr, 16);
		if (value != ULONG_MAX) {
			strap = value;
			printf("Strap set to 0x%x\n", strap);
			return 0;
		}

		fprintf(stderr, "Invalid strap value!\n");
	}

	return 1;
}